

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

char * __thiscall
sisl::body_centered_cubic<char>::operator()(body_centered_cubic<char> *this,int d0,...)

{
  char in_AL;
  bool bVar1;
  uint uVar2;
  undefined8 *puVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  ulong uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_5c;
  undefined4 local_58;
  int zmod;
  va_list vl;
  int az;
  int ay;
  int ax;
  int _z;
  int _y;
  int _x;
  int d0_local;
  body_centered_cubic<char> *this_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = local_118;
  vl[0]._0_8_ = &stack0x00000008;
  zmod = 0x30;
  ax = (uint)local_108;
  local_58 = 0x20;
  ay = (uint)local_100;
  this->__zero = '\0';
  uVar5 = (ulong)(uint)local_108;
  uVar4 = (ulong)(uint)local_100;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  _z = d0;
  _y = d0;
  __x = this;
  uVar2 = (*(this->super_base_lattice<char>)._vptr_base_lattice[0xf])
                    (this,(ulong)(uint)d0,uVar5,uVar4);
  if ((uVar2 & 1) == 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "body_centered_cubic::operator() - given non lattice site!";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  bVar1 = in_bound(this,&_z,&ax,&ay);
  if (bVar1) {
    local_5c = ay % 2;
    this_local = (body_centered_cubic<char> *)
                 array_n<char,_3,_std::allocator<char>_>::operator()
                           (&this->_array,(_z - local_5c) / 2,(ulong)(uint)((ax - local_5c) / 2),
                            (ulong)(uint)ay);
  }
  else {
    this_local = (body_centered_cubic<char> *)&this->__zero;
  }
  return (char *)this_local;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;
            va_list vl;

            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;

            if(!is_lattice_site(_x, _y, _z)) throw "body_centered_cubic::operator() - given non lattice site!";
            if(!in_bound(_x, _y, _z))  return __zero;

            // Transform to 3d array index
            {
                int zmod = _z % 2;
                ax = (_x - zmod) / 2;
                ay = (_y - zmod) / 2;
                az = _z;
            }

            return _array(ax, ay, az);
        }